

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O1

int __thiscall
lzham::adaptive_arith_data_model::init(adaptive_arith_data_model *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  uint uVar2;
  uint in_EDX;
  int iVar3;
  undefined8 unaff_RBP;
  undefined7 uVar4;
  uint uVar5;
  long lVar6;
  adaptive_bit_model *paVar7;
  
  uVar4 = (undefined7)((ulong)unaff_RBP >> 8);
  if (in_EDX != 1) {
    if (in_EDX == 0) {
      this->m_total_syms = 0;
      paVar7 = (this->m_probs).m_p;
      iVar3 = (int)CONCAT71(uVar4,1);
      if (paVar7 == (adaptive_bit_model *)0x0) {
        return iVar3;
      }
      lzham_free(paVar7);
      (this->m_probs).m_p = (adaptive_bit_model *)0x0;
      (this->m_probs).m_size = 0;
      (this->m_probs).m_capacity = 0;
      return iVar3;
    }
    if ((in_EDX & in_EDX - 1) == 0) goto LAB_0011c938;
  }
  uVar2 = in_EDX - 1 >> 0x10 | in_EDX - 1;
  uVar2 = uVar2 >> 8 | uVar2;
  uVar2 = uVar2 >> 4 | uVar2;
  uVar2 = uVar2 >> 2 | uVar2;
  in_EDX = (uVar2 >> 1 | uVar2) + 1;
LAB_0011c938:
  this->m_total_syms = in_EDX;
  uVar2 = (this->m_probs).m_size;
  if (uVar2 != in_EDX) {
    if (uVar2 <= in_EDX) {
      if (((this->m_probs).m_capacity < in_EDX) &&
         (bVar1 = elemental_vector::increase_capacity
                            ((elemental_vector *)&this->m_probs,in_EDX,uVar2 + 1 == in_EDX,2,
                             vector<lzham::adaptive_bit_model>::object_mover,true), !bVar1)) {
        return 0;
      }
      uVar2 = (this->m_probs).m_size;
      uVar5 = in_EDX - uVar2;
      if (uVar5 != 0) {
        paVar7 = (this->m_probs).m_p + uVar2;
        lVar6 = (ulong)uVar5 * 2;
        do {
          adaptive_bit_model::adaptive_bit_model(paVar7);
          paVar7 = paVar7 + 1;
          lVar6 = lVar6 + -2;
        } while (lVar6 != 0);
      }
    }
    (this->m_probs).m_size = in_EDX;
  }
  return (int)CONCAT71(uVar4,1);
}

Assistant:

bool adaptive_arith_data_model::init(bool encoding, uint total_syms)
   {
      encoding;
      if (!total_syms)
      {
         clear();
         return true;
      }

      if ((total_syms < 2) || (!math::is_power_of_2(total_syms)))
         total_syms = math::next_pow2(total_syms);

      m_total_syms = total_syms;

      if (!m_probs.try_resize(m_total_syms))
         return false;

      return true;
   }